

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_if.c
# Opt level: O1

int max_ex_tab(expr *expr,fts_symbol_t s,ex_ex *arg,ex_ex *optr)

{
  int iVar1;
  _garray *x;
  long lVar2;
  char *pcVar3;
  int size;
  t_word *wvec;
  int local_2c;
  t_word *local_28;
  
  if (s == (fts_symbol_t)0x0) {
    optr->ex_type = 2;
    (optr->ex_cont).v_flt = 0.0;
  }
  else {
    x = (_garray *)pd_findbyclass(s,garray_class);
    if ((x != (_garray *)0x0) && (iVar1 = garray_getfloatwords(x,&local_2c,&local_28), iVar1 != 0))
    {
      optr->ex_type = 2;
      if (arg->ex_type == 2) {
        lVar2 = (long)(arg->ex_cont).v_flt;
      }
      else if (arg->ex_type == 1) {
        lVar2 = (arg->ex_cont).v_int;
      }
      else {
        lVar2 = 0;
        pd_error(expr,"expr: bad argument for table \'%s\'\n",s->s_name);
      }
      if (lVar2 < 0) {
        lVar2 = 0;
      }
      else if (local_2c <= lVar2) {
        lVar2 = (long)local_2c + -1;
      }
      (optr->ex_cont).v_flt = local_28[lVar2].w_float;
      return 0;
    }
    optr->ex_type = 2;
    (optr->ex_cont).v_flt = 0.0;
    if (s != (fts_symbol_t)0x0) {
      pcVar3 = s->s_name;
      goto LAB_0019fd1e;
    }
  }
  pcVar3 = (char *)0x0;
LAB_0019fd1e:
  pd_error(expr,"no such table \'%s\'",pcVar3);
  return 1;
}

Assistant:

int
max_ex_tab(struct expr *expr, fts_symbol_t s, struct ex_ex *arg,
    struct ex_ex *optr)
{
#ifdef PD
        t_garray *garray;
        int size;
        long indx;
        t_word *wvec;

        if (!s || !(garray = (t_garray *)pd_findbyclass(s, garray_class)) ||
            !garray_getfloatwords(garray, &size, &wvec))
        {
                optr->ex_type = ET_FLT;
                optr->ex_flt = 0;
                pd_error(expr, "no such table '%s'", ex_symname(s));
                return (1);
        }
        optr->ex_type = ET_FLT;

        switch (arg->ex_type) {
        case ET_INT:
                indx = arg->ex_int;
                break;
        case ET_FLT:
                /* strange interpolation code deleted here -msp */
                indx = arg->ex_flt;
                break;

        default:        /* do something with strings */
                pd_error(expr, "expr: bad argument for table '%s'\n", fts_symbol_name(s));
                indx = 0;
        }
        if (indx < 0) indx = 0;
        else if (indx >= size) indx = size - 1;
        optr->ex_flt = wvec[indx].w_float;
#else /* MSP */
        /*
         * table lookup not done for MSP yet
         */
        post("max_ex_tab: not complete for MSP yet!");
        optr->ex_type = ET_FLT;
        optr->ex_flt = 0;
#endif
        return (0);
}